

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByNumber(Descriptor *this,int key)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *result;
  int key_local;
  Descriptor *this_local;
  
  pFVar2 = file(this);
  this_local = (Descriptor *)
               FileDescriptorTables::FindFieldByNumber
                         (*(FileDescriptorTables **)(pFVar2 + 0xa8),this,key);
  if ((this_local == (Descriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this_local), bVar1)) {
    this_local = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor*
Descriptor::FindFieldByNumber(int key) const {
  const FieldDescriptor* result =
    file()->tables_->FindFieldByNumber(this, key);
  if (result == NULL || result->is_extension()) {
    return NULL;
  } else {
    return result;
  }
}